

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

xml_node<char> * __thiscall
rapidxml::xml_document<char>::parse_element<0>(xml_document<char> *this,char **text)

{
  xml_node<char> *node;
  parse_error *ppVar1;
  char *pcVar2;
  size_t sVar3;
  char *name;
  xml_node<char> *element;
  char **text_local;
  xml_document<char> *this_local;
  
  node = memory_pool<char>::allocate_node
                   (&this->super_memory_pool<char>,node_element,(char *)0x0,(char *)0x0,0,0);
  pcVar2 = *text;
  skip<rapidxml::xml_document<char>::node_name_pred,0>(text);
  if (*text == pcVar2) {
    ppVar1 = (parse_error *)__cxa_allocate_exception(0x18);
    parse_error::parse_error(ppVar1,"expected element name",*text);
    __cxa_throw(ppVar1,&parse_error::typeinfo,parse_error::~parse_error);
  }
  xml_base<char>::name(&node->super_xml_base<char>,pcVar2,(long)*text - (long)pcVar2);
  skip<rapidxml::xml_document<char>::whitespace_pred,0>(text);
  parse_node_attributes<0>(this,text,node);
  if (**text == '>') {
    *text = *text + 1;
    parse_node_contents<0>(this,text,node);
  }
  else {
    if (**text != '/') {
      ppVar1 = (parse_error *)__cxa_allocate_exception(0x18);
      parse_error::parse_error(ppVar1,"expected >",*text);
      __cxa_throw(ppVar1,&parse_error::typeinfo,parse_error::~parse_error);
    }
    *text = *text + 1;
    if (**text != '>') {
      ppVar1 = (parse_error *)__cxa_allocate_exception(0x18);
      parse_error::parse_error(ppVar1,"expected >",*text);
      __cxa_throw(ppVar1,&parse_error::typeinfo,parse_error::~parse_error);
    }
    *text = *text + 1;
  }
  pcVar2 = xml_base<char>::name(&node->super_xml_base<char>);
  sVar3 = xml_base<char>::name_size(&node->super_xml_base<char>);
  pcVar2[sVar3] = '\0';
  return node;
}

Assistant:

xml_node<Ch> *parse_element(Ch *&text)
        {
            // Create element node
            xml_node<Ch> *element = this->allocate_node(node_element);

            // Extract element name
            Ch *name = text;
            skip<node_name_pred, Flags>(text);
            if (text == name)
                RAPIDXML_PARSE_ERROR("expected element name", text);
            element->name(name, text - name);
            
            // Skip whitespace between element name and attributes or >
            skip<whitespace_pred, Flags>(text);

            // Parse attributes, if any
            parse_node_attributes<Flags>(text, element);

            // Determine ending type
            if (*text == Ch('>'))
            {
                ++text;
                parse_node_contents<Flags>(text, element);
            }
            else if (*text == Ch('/'))
            {
                ++text;
                if (*text != Ch('>'))
                    RAPIDXML_PARSE_ERROR("expected >", text);
                ++text;
            }
            else
                RAPIDXML_PARSE_ERROR("expected >", text);

            // Place zero terminator after name
            if (!(Flags & parse_no_string_terminators))
                element->name()[element->name_size()] = Ch('\0');

            // Return parsed element
            return element;
        }